

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

void __thiscall
FOptionMenuItemOptionBase::FOptionMenuItemOptionBase
          (FOptionMenuItemOptionBase *this,char *label,char *menu,char *values,char *graycheck,
          int center)

{
  FBaseCVar *pFVar1;
  FName local_38;
  int local_34;
  char *pcStack_30;
  int center_local;
  char *graycheck_local;
  char *values_local;
  char *menu_local;
  char *label_local;
  FOptionMenuItemOptionBase *this_local;
  
  local_34 = center;
  pcStack_30 = graycheck;
  graycheck_local = values;
  values_local = menu;
  menu_local = label;
  label_local = (char *)this;
  FName::FName(&local_38,menu);
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,label,&local_38,false);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuItemOptionBase_009ed130;
  FName::FName((FName *)&(this->super_FOptionMenuItem).field_0x24);
  FName::operator=((FName *)&(this->super_FOptionMenuItem).field_0x24,graycheck_local);
  pFVar1 = FindCVar(pcStack_30,(FBaseCVar **)0x0);
  this->mGrayCheck = pFVar1;
  this->mCenter = local_34;
  return;
}

Assistant:

FOptionMenuItemOptionBase(const char *label, const char *menu, const char *values, const char *graycheck, int center)
		: FOptionMenuItem(label, menu)
	{
		mValues = values;
		mGrayCheck = (FBoolCVar*)FindCVar(graycheck, NULL);
		mCenter = center;
	}